

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>_> *
__thiscall
tinyusdz::primvar::PrimVar::
get_default_value<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
          (optional<std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>_>
           *__return_storage_ptr__,PrimVar *this)

{
  optional<std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>_>
  local_38;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  get_value<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
            (&local_38,this);
  nonstd::optional_lite::
  optional<std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>_>::
  optional<std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>,_0>
            (__return_storage_ptr__,&local_38);
  nonstd::optional_lite::
  optional<std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>_>::
  ~optional(&local_38);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }